

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_binary_expr(gvisitor_t *self,gnode_binary_expr_t *node)

{
  gtoken_t op;
  long *plVar1;
  ircode_t *code;
  uint32_t p3;
  uint32_t p2;
  uint32_t p1;
  opcode_t op_00;
  uint32_t uVar2;
  
  plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar1 == (long *)0x0) || ((gravity_class_t *)*plVar1 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  code = (ircode_t *)plVar1[0x14];
  if (node->op == TOK_OP_ASSIGN) {
    gvisit(self,node->right);
    gvisit(self,node->left);
    ircode_add_check(code);
    return;
  }
  gvisit(self,node->left);
  gvisit(self,node->right);
  p3 = ircode_register_pop(code);
  if (p3 == 0xffffffff) {
    report_error(self,node->right,"Invalid right expression.");
  }
  p2 = ircode_register_pop(code);
  if (p2 == 0xffffffff) {
    report_error(self,node->left,"Invalid left expression.");
  }
  p1 = ircode_register_push_temp(code);
  op = node->op;
  if (op - TOK_OP_RANGE_EXCLUDED < 2) {
    if (node == (gnode_binary_expr_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (node->base).token.lineno;
    }
    ircode_add_tag(code,RANGENEW,p1,p2,p3,(op != TOK_OP_RANGE_INCLUDED) + RANGE_INCLUDE_TAG,uVar2);
    return;
  }
  op_00 = token2opcode(op);
  if (node == (gnode_binary_expr_t *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (node->base).token.lineno;
  }
  ircode_add(code,op_00,p1,p2,p3,uVar2);
  return;
}

Assistant:

static void visit_binary_expr (gvisitor_t *self, gnode_binary_expr_t *node) {
    DEBUG_CODEGEN("visit_binary_expr %s", token_name(node->op));
    DECLARE_CODE();

    // assignment is right associative
    if (node->op == TOK_OP_ASSIGN) {
        CODEGEN_COUNT_REGISTERS(n1);

        visit(node->right);
        visit(node->left);    // left expression can be: IDENTIFIER, FILE, POSTIFIX (not a call)

        CODEGEN_COUNT_REGISTERS(n2);
        CODEGEN_ASSERT_REGISTERS(n1, n2, 0);
        
        // Checkpoint added to support STRUCT
        ircode_add_check(code);
        return;
    }

    CODEGEN_COUNT_REGISTERS(n1);

    // visiting binary operation from left to right
    visit(node->left);
    visit(node->right);

    uint32_t r3 = ircode_register_pop(code);
    if (r3 == REGISTER_ERROR) report_error(self, (gnode_t *)node->right, "Invalid right expression.");
    uint32_t r2 = ircode_register_pop(code);
    if (r2 == REGISTER_ERROR) report_error(self, (gnode_t *)node->left, "Invalid left expression.");
    uint32_t r1 = ircode_register_push_temp(code);

    // a special instruction needs to be generated for a binary expression of type RANGE
    if ((node->op == TOK_OP_RANGE_INCLUDED) || (node->op == TOK_OP_RANGE_EXCLUDED)) {
		ircode_add_tag(code, RANGENEW, r1, r2, r3, (node->op == TOK_OP_RANGE_INCLUDED) ? RANGE_INCLUDE_TAG : RANGE_EXCLUDE_TAG, LINE_NUMBER(node));
        return;
    }

    // generate code for binary OP
    opcode_t op = token2opcode(node->op);
	ircode_add(code, op, r1, r2, r3, LINE_NUMBER(node));

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}